

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeRepresentation.hpp
# Opt level: O2

pair<bool,_bool> __thiscall
helics::TimeCoordinator::checkAndSendTimeRequest
          (TimeCoordinator *this,ActionMessage *upd,GlobalFederateId skipFed)

{
  int iVar1;
  int iVar2;
  long lVar3;
  pair<bool,_bool> pVar4;
  bool bVar5;
  
  lVar3 = (upd->actionTime).internalTimeCode;
  iVar1 = (upd->dest_handle).hid;
  iVar2 = (this->super_BaseTimeCoordinator).sequenceCounter;
  bVar5 = (bool)(*(byte *)((long)&upd->flags + 1) & 1);
  if (((((this->lastSend).interrupted == bVar5) && ((this->lastSend).sequenceCounter == iVar2)) &&
      ((this->lastSend).mTimeState == time_requested)) &&
     ((((this->lastSend).minFed.gid == iVar1 &&
       ((this->lastSend).Te.internalTimeCode == (upd->Te).internalTimeCode)) &&
      (((this->lastSend).minDe.internalTimeCode == (upd->Tdemin).internalTimeCode &&
       ((this->lastSend).next.internalTimeCode == lVar3)))))) {
    pVar4.first = false;
    pVar4.second = false;
    return pVar4;
  }
  (this->lastSend).next.internalTimeCode = lVar3;
  (this->lastSend).minDe.internalTimeCode = (upd->Tdemin).internalTimeCode;
  (this->lastSend).Te.internalTimeCode = (upd->Te).internalTimeCode;
  (this->lastSend).sequenceCounter = iVar2;
  (this->lastSend).minFed.gid = iVar1;
  (this->lastSend).mTimeState = time_requested;
  (this->lastSend).interrupted = bVar5;
  bVar5 = transmitTimingMessages(this,upd,skipFed);
  return (pair<bool,_bool>)((ushort)bVar5 * 0x100 + 1);
}

Assistant:

bool operator!=(const TimeRepresentation& rhs) const noexcept
    {
        return (internalTimeCode != rhs.internalTimeCode);
    }